

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O0

void __thiscall string_view_size_Test::TestBody(string_view_size_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_d8;
  Message local_d0;
  size_type local_c8;
  uint local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_2;
  string_view sv3;
  Message local_90;
  size_type local_88;
  undefined4 local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  string_view sv2;
  AssertHelper local_50;
  Message local_48;
  size_type local_40;
  undefined4 local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  string_view sv1;
  string_view_size_Test *this_local;
  
  wabt::string_view::string_view((string_view *)&gtest_ar.message_);
  local_34 = 0;
  local_40 = wabt::string_view::size((string_view *)&gtest_ar.message_);
  testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
            (local_30,"0U",(uint *)"sv1.size()",(unsigned_long *)&local_34,&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (bVar1) {
    wabt::string_view::string_view((string_view *)&gtest_ar_1.message_,"");
    local_7c = 0;
    local_88 = wabt::string_view::size((string_view *)&gtest_ar_1.message_);
    testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
              (local_78,"0U",(uint *)"sv2.size()",(unsigned_long *)&local_7c,&local_88);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&sv3.size_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
                 ,0x7f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&sv3.size_,&local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sv3.size_);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
    if (bVar1) {
      wabt::string_view::string_view((string_view *)&gtest_ar_2.message_,"hello");
      local_bc = 5;
      local_c8 = wabt::string_view::size((string_view *)&gtest_ar_2.message_);
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_b8,"5U","sv3.size()",&local_bc,&local_c8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
      if (!bVar1) {
        testing::Message::Message(&local_d0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
                   ,0x82,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_d8);
        testing::Message::~Message(&local_d0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    }
  }
  return;
}

Assistant:

TEST(string_view, size) {
  string_view sv1;
  ASSERT_EQ(0U, sv1.size());

  string_view sv2("");
  ASSERT_EQ(0U, sv2.size());

  string_view sv3("hello");
  ASSERT_EQ(5U, sv3.size());
}